

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_int64 UnixFile_Read(void *pUserData,void *pBuffer,jx9_int64 nDatatoRead)

{
  ssize_t sVar1;
  
  sVar1 = read((int)pUserData,pBuffer,nDatatoRead);
  if (sVar1 < 1) {
    sVar1 = -1;
  }
  return sVar1;
}

Assistant:

static jx9_int64 UnixFile_Read(void *pUserData, void *pBuffer, jx9_int64 nDatatoRead)
{
	ssize_t nRd;
	nRd = read(SX_PTR_TO_INT(pUserData), pBuffer, (size_t)nDatatoRead);
	if( nRd < 1 ){
		/* EOF or IO error */
		return -1;
	}
	return (jx9_int64)nRd;
}